

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JlMemory.c
# Opt level: O1

JL_STATUS JlMemoryWriteCountValue(void *CountFieldPtr,size_t CountFieldSize,size_t CountValue)

{
  JL_STATUS JVar1;
  
  JVar1 = JL_STATUS_INTERNAL_ERROR;
  switch(CountFieldSize) {
  case 1:
    if (0xff < CountValue) {
      return JL_STATUS_COUNT_FIELD_TOO_SMALL;
    }
    *(char *)CountFieldPtr = (char)CountValue;
    break;
  case 2:
    if (0xffff < CountValue) {
      return JL_STATUS_COUNT_FIELD_TOO_SMALL;
    }
    *(short *)CountFieldPtr = (short)CountValue;
    break;
  default:
    goto switchD_0010238f_caseD_3;
  case 4:
    if (CountValue >> 0x20 != 0) {
      return JL_STATUS_COUNT_FIELD_TOO_SMALL;
    }
    *(int *)CountFieldPtr = (int)CountValue;
    break;
  case 8:
    *(size_t *)CountFieldPtr = CountValue;
  }
  JVar1 = JL_STATUS_SUCCESS;
switchD_0010238f_caseD_3:
  return JVar1;
}

Assistant:

JL_STATUS
    JlMemoryWriteCountValue
    (
        void*           CountFieldPtr,
        size_t          CountFieldSize,
        size_t          CountValue
    )
{
    JL_STATUS jlStatus;

    if( sizeof(uint8_t) == CountFieldSize )
    {
        uint8_t* countElementInStructU8 = (uint8_t*)CountFieldPtr;
        if( CountValue <= UINT8_MAX )
        {
            *countElementInStructU8 = (uint8_t)CountValue;
            jlStatus = JL_STATUS_SUCCESS;
        }
        else
        {
            jlStatus = JL_STATUS_COUNT_FIELD_TOO_SMALL;
        }
    }
    else if( sizeof(uint16_t) == CountFieldSize )
    {
        uint16_t* countElementInStructU16 = (uint16_t*)CountFieldPtr;
        if( CountValue <= UINT16_MAX )
        {
            *countElementInStructU16 = (uint16_t)CountValue;
            jlStatus = JL_STATUS_SUCCESS;
        }
        else
        {
            jlStatus = JL_STATUS_COUNT_FIELD_TOO_SMALL;
        }
    }
    else if( sizeof(uint32_t) == CountFieldSize )
    {
        uint32_t* countElementInStructU32 = (uint32_t*)CountFieldPtr;
        if( CountValue <= UINT32_MAX )
        {
            *countElementInStructU32 = (uint32_t)CountValue;
            jlStatus = JL_STATUS_SUCCESS;
        }
        else
        {
            jlStatus = JL_STATUS_COUNT_FIELD_TOO_SMALL;
        }
    }
    else if( sizeof(uint64_t) == CountFieldSize )
    {
        uint64_t* countElementInStructU64 = (uint64_t*)CountFieldPtr;
        *countElementInStructU64 = CountValue;
        jlStatus = JL_STATUS_SUCCESS;
    }
    else
    {
        // Invalid size.
        jlStatus = JL_STATUS_INTERNAL_ERROR;
    }

    return jlStatus;
}